

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O2

string * EncodeBase58Check_abi_cxx11_
                   (string *__return_storage_ptr__,Span<const_unsigned_char> input)

{
  long in_FS_OFFSET;
  Span<const_unsigned_char> input_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  uint256 hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  uint256 local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,input.m_data,
             input.m_data + input.m_size,(allocator_type *)&local_38);
  Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_38,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,
             (const_iterator)local_50._M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_38,
             local_38.super_base_blob<256U>.m_data._M_elems + 4);
  input_00.m_size =
       (long)local_50._M_impl.super__Vector_impl_data._M_finish -
       (long)local_50._M_impl.super__Vector_impl_data._M_start;
  input_00.m_data = local_50._M_impl.super__Vector_impl_data._M_start;
  EncodeBase58_abi_cxx11_(__return_storage_ptr__,input_00);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeBase58Check(Span<const unsigned char> input)
{
    // add 4-byte hash check to the end
    std::vector<unsigned char> vch(input.begin(), input.end());
    uint256 hash = Hash(vch);
    vch.insert(vch.end(), (unsigned char*)&hash, (unsigned char*)&hash + 4);
    return EncodeBase58(vch);
}